

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

void __thiscall
rtb::Filter::Polynomial<double>::removeHighOrderZeroCoefficients(Polynomial<double> *this)

{
  pointer pcVar1;
  pointer pcVar2;
  size_t sVar3;
  pointer pcVar4;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__range2;
  double dVar5;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  it;
  pointer local_28;
  pointer local_20;
  pointer local_18;
  
  pcVar1 = (this->coefficients_).
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->coefficients_).
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar1 == pcVar2) {
    dVar5 = 0.0;
  }
  else {
    dVar5 = 0.0;
    pcVar4 = pcVar1;
    do {
      dVar5 = dVar5 + *(double *)pcVar4->_M_value;
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 != pcVar2);
  }
  if (0x10 < (ulong)((long)pcVar2 - (long)pcVar1)) {
    dVar5 = cabs(dVar5);
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      local_20 = (this->coefficients_).
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      local_18 = (this->coefficients_).
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>>,__gnu_cxx::__ops::_Iter_pred<rtb::Filter::Polynomial<double>::removeHighOrderZeroCoefficients()::_lambda(std::complex<double>)_1_>>
                (&local_28);
      pcVar1 = (this->coefficients_).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((local_28 != pcVar1) &&
         (pcVar2 = (this->coefficients_).
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
         local_28 = (pointer)((long)local_28 + ((long)pcVar2 - (long)pcVar1)), pcVar2 != local_28))
      {
        (this->coefficients_).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = local_28;
      }
    }
  }
  sVar3 = (long)(this->coefficients_).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->coefficients_).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4;
  this->size_ = sVar3;
  this->order_ = sVar3 - 1;
  return;
}

Assistant:

void Polynomial<T>::removeHighOrderZeroCoefficients() {

            Complex sum(0);
            for (auto c : coefficients_)
                sum += c;

            if (coefficients_.size() > 1 && std::abs(sum) != 0) {
                auto it = std::find_if(coefficients_.rbegin(), coefficients_.rend(), [](Complex v){ return std::abs(v) != 0;      });
                coefficients_.erase(it.base(), coefficients_.end());
            }
            updateOrderAndSize();
        }